

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

string * __thiscall
glu::getProgramInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,glu *this,Functions *gl,deUint32 program)

{
  deUint32 err;
  undefined4 in_register_0000000c;
  long lVar1;
  int unusedLen;
  int infoLogLen;
  vector<char,_std::allocator<char>_> infoLog;
  allocator<char> local_42;
  allocator_type local_41;
  undefined1 local_40 [4];
  int local_3c;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_3c = 0;
  (**(code **)(this + 0x9d8))
            ((ulong)gl & 0xffffffff,0x8b84,&local_3c,CONCAT44(in_register_0000000c,program));
  err = (**(code **)(this + 0x800))();
  checkError(err,"glGetProgramiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x98);
  if (local_3c < 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_42 = (allocator<char>)0x0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_38,(long)(local_3c + 3),
               (value_type *)&local_42,&local_41);
    (**(code **)(this + 0x988))
              ((ulong)gl & 0xffffffff,
               ~(uint)local_38._M_impl.super__Vector_impl_data._M_start +
               (int)local_38._M_impl.super__Vector_impl_data._M_finish,local_40);
    lVar1 = CONCAT44(local_38._M_impl.super__Vector_impl_data._M_finish._4_4_,
                     (int)local_38._M_impl.super__Vector_impl_data._M_finish) -
            (long)local_38._M_impl.super__Vector_impl_data._M_start;
    if (local_38._M_impl.super__Vector_impl_data._M_start[(int)lVar1 + -1] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,local_38._M_impl.super__Vector_impl_data._M_start,
                 &local_42);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_38._M_impl.super__Vector_impl_data._M_start,
                 local_38._M_impl.super__Vector_impl_data._M_start + lVar1);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getProgramInfoLog (const glw::Functions& gl, deUint32 program)
{
	int infoLogLen = 0;
	int unusedLen;

	gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLen);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv()");

	if (infoLogLen > 0)
	{
		// The INFO_LOG_LENGTH query and the buffer query implementations have
		// very commonly off-by-one errors. Try to work around these issues.

		// add tolerance for off-by-one in log length, buffer write, and for terminator
		std::vector<char> infoLog(infoLogLen + 3, '\0');

		// claim buf size is one smaller to protect from off-by-one writing over buffer bounds
		gl.getProgramInfoLog(program, (int)infoLog.size() - 1, &unusedLen, &infoLog[0]);

		// return whole buffer if null terminator was overwritten
		if (infoLog[(int)(infoLog.size()) - 1] != '\0')
			return std::string(&infoLog[0], infoLog.size());

		// read as C string. infoLog is guaranteed to be 0-terminated
		return std::string(&infoLog[0]);
	}
	return std::string();
}